

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_1_list_prefix_expr(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_REDUCE,G->val[-4],G->val[-3]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_list_prefix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define r G->val[-1]
#define l G->val[-2]
#define b G->val[-3]
#define a G->val[-4]
  yyprintf((stderr, "do yy_1_list_prefix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_REDUCE, a, b); }\n"));
  yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_REDUCE, a, b); ;
#undef r
#undef l
#undef b
#undef a
}